

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.h
# Opt level: O0

void __thiscall cmGraphVizWriter::Connection::Connection(Connection *this,Connection *param_1)

{
  Connection *param_1_local;
  Connection *this_local;
  
  cmLinkItem::cmLinkItem(&this->src,&param_1->src);
  cmLinkItem::cmLinkItem(&this->dst,&param_1->dst);
  std::__cxx11::string::string((string *)&this->scopeType,(string *)&param_1->scopeType);
  return;
}

Assistant:

Connection(cmLinkItem s, cmLinkItem d, std::string scope)
      : src(std::move(s))
      , dst(std::move(d))
      , scopeType(std::move(scope))
    {
    }